

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall spirv_cross::CompilerMSL::uses_explicit_early_fragment_test(CompilerMSL *this)

{
  SPIREntryPoint *pSVar1;
  size_type sVar2;
  bool bVar3;
  key_type_conflict local_4;
  
  pSVar1 = Compiler::get_entry_point((Compiler *)this);
  bVar3 = true;
  if (((pSVar1->flags).lower & 0x200) == 0) {
    sVar2 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(pSVar1->flags).higher._M_h,&local_4);
    bVar3 = sVar2 != 0;
  }
  return bVar3;
}

Assistant:

bool CompilerMSL::uses_explicit_early_fragment_test()
{
	auto &ep_flags = get_entry_point().flags;
	return ep_flags.get(ExecutionModeEarlyFragmentTests) || ep_flags.get(ExecutionModePostDepthCoverage);
}